

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerlinNoise.cpp
# Opt level: O1

void __thiscall PerlinNoise::PerlinNoise(PerlinNoise *this)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  int iVar6;
  undefined1 local_2728 [8];
  mt19937 engine;
  random_device rd;
  
  (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->p,0x100);
  piVar3 = (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar1) {
    iVar6 = 0;
    do {
      *piVar3 = iVar6;
      iVar6 = iVar6 + 1;
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
  }
  std::random_device::random_device((random_device *)&engine._M_p);
  uVar2 = std::random_device::_M_getval();
  local_2728 = (undefined1  [8])(ulong)uVar2;
  lVar5 = 1;
  uVar4 = (ulong)local_2728;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
    engine._M_x[lVar5 + -1] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  engine._M_x[0x26f] = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2728);
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)this,
             (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,
             (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start);
  std::random_device::_M_fini();
  return;
}

Assistant:

PerlinNoise::PerlinNoise() {
    p.resize(256);

    // Fill p with values from 0 to 255
    std::iota(p.begin(), p.end(), 0);

    // Initialize a random engine
    std::random_device rd;
    std::mt19937 engine(rd());

    // Suffle  using the above random engine
    std::shuffle(p.begin(), p.end(), engine);

    // Duplicate the permutation vector
    p.insert(p.end(), p.begin(), p.end());
}